

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O2

int ctemplate_htmlparser::jsparser_buffer_last_identifier(jsparser_ctx *js,char *identifier)

{
  char c;
  byte bVar1;
  int iVar2;
  uint end;
  uint pos;
  
  if (identifier != (char *)0x0) {
    c = jsparser_buffer_get(js,-1);
    iVar2 = js_is_whitespace(c);
    end = iVar2 == 0 | 0xfffffffe;
    pos = end;
    while( true ) {
      bVar1 = jsparser_buffer_get(js,pos);
      if ((((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) && (bVar1 != 0x5f)
          ) && (bVar1 != 0x24)) break;
      pos = pos - 1;
    }
    iVar2 = pos + 1;
    if ((int)end <= iVar2) {
      *identifier = '\0';
    }
    else {
      jsparser_buffer_slice(js,identifier,iVar2,end);
    }
    return (uint)((int)end > iVar2);
  }
  __assert_fail("identifier != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                ,0x14c,
                "int ctemplate_htmlparser::jsparser_buffer_last_identifier(jsparser_ctx *, char *)")
  ;
}

Assistant:

int jsparser_buffer_last_identifier(jsparser_ctx *js, char *identifier)
{
  int end;
  int pos;

  assert(identifier != NULL);

  end = -1;
  /* Ignore the optional whitespace delimiter */
  if (js_is_whitespace(jsparser_buffer_get(js, -1))) {
    --end;
  }

  /* Find the beginning of the identifier. This loop ends either when we find a
   * character that doesn't belong to an identifier, or when we find a '\0'
   * character, which means we reached the end of the buffer. */
  for(pos = end; js_is_identifier(jsparser_buffer_get(js, pos)); --pos) {
  }
  if (pos + 1 >= end) {
    identifier[0] = '\0';
    return 0;
  }

  jsparser_buffer_slice(js, identifier, pos + 1, end);
  return 1;
}